

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O2

bool cmWhileCommand(vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
                   cmExecutionStatus *status)

{
  pointer pcVar1;
  pointer pcVar2;
  cmMakefile *this;
  _Head_base<0UL,_cmFunctionBlocker_*,_false> local_50;
  undefined1 local_48 [8];
  _Head_base<0UL,_cmFunctionBlocker_*,_false> local_40 [4];
  
  pcVar1 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar1 == pcVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_40,"called with incorrect number of arguments",
               (allocator<char> *)local_48);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this = status->Makefile;
    local_48 = (undefined1  [8])this;
    std::
    make_unique<cmWhileFunctionBlocker,cmMakefile*,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>const&>
              ((cmMakefile **)local_40,
               (vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_48);
    local_50._M_head_impl = local_40[0]._M_head_impl;
    local_40[0]._M_head_impl = (cmFunctionBlocker *)0x0;
    cmMakefile::AddFunctionBlocker
              (this,(unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> *)
                    &local_50);
    if (local_50._M_head_impl != (cmFunctionBlocker *)0x0) {
      (**(code **)((((string *)&(local_50._M_head_impl)->_vptr_cmFunctionBlocker)->_M_dataplus)._M_p
                  + 8))();
    }
    local_50._M_head_impl = (cmFunctionBlocker *)0x0;
    if (local_40[0]._M_head_impl != (cmFunctionBlocker *)0x0) {
      (**(code **)((((string *)&(local_40[0]._M_head_impl)->_vptr_cmFunctionBlocker)->_M_dataplus).
                   _M_p + 8))();
    }
  }
  return pcVar1 != pcVar2;
}

Assistant:

bool cmWhileCommand(std::vector<cmListFileArgument> const& args,
                    cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // create a function blocker
  auto& makefile = status.GetMakefile();
  makefile.AddFunctionBlocker(
    cm::make_unique<cmWhileFunctionBlocker>(&makefile, args));

  return true;
}